

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeverityControl.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  data_ref pacVar3;
  Session *this;
  uint64_t eventSourceId;
  uint64_t _binlog_sid_v_13;
  uint64_t _binlog_sid_v_12;
  uint64_t _binlog_sid_v_11;
  uint64_t _binlog_sid_v_10;
  uint64_t _binlog_sid_v_9;
  uint64_t _binlog_sid_v_8;
  uint64_t _binlog_sid_v_7;
  uint64_t _binlog_sid_v_6;
  uint64_t _binlog_sid_v_5;
  uint64_t _binlog_sid_v_4;
  uint64_t _binlog_sid_v_3;
  uint64_t _binlog_sid_v_2;
  uint64_t _binlog_sid_v_1;
  uint64_t _binlog_sid_v;
  Session *session;
  memory_order __b_26;
  memory_order __b_24;
  memory_order __b_22;
  memory_order __b_20;
  memory_order __b_18;
  memory_order __b_16;
  memory_order __b_14;
  memory_order __b_12;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_27;
  memory_order __b_25;
  memory_order __b_23;
  memory_order __b_21;
  memory_order __b_19;
  memory_order __b_17;
  memory_order __b_15;
  memory_order __b_13;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  char (*in_stack_ffffffffffffe808) [9];
  __atomic_base<unsigned_long> in_stack_ffffffffffffe810;
  char (*in_stack_ffffffffffffe818) [11];
  atomic<unsigned_long> *in_stack_ffffffffffffe820;
  EventSource *in_stack_ffffffffffffe838;
  EventSource *eventSource;
  Session *in_stack_ffffffffffffe840;
  undefined1 local_e8d [7];
  cx_string<1UL> local_e86;
  allocator local_e84;
  allocator local_e83;
  allocator local_e82;
  allocator local_e81;
  undefined8 local_e80;
  undefined2 local_e78;
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  undefined8 local_e10;
  string local_e08 [32];
  string local_de8 [32];
  __atomic_base<unsigned_long> local_dc8;
  undefined1 local_dba;
  undefined1 local_db9;
  undefined1 local_db8;
  undefined1 local_db7;
  allocator local_db6;
  cx_string<0UL> local_db5;
  allocator local_db4;
  allocator local_db3;
  allocator local_db2;
  allocator local_db1;
  undefined8 local_db0;
  undefined2 local_da8;
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  undefined8 local_d40;
  string local_d38 [32];
  string local_d18 [32];
  __atomic_base<unsigned_long> local_cf8;
  undefined1 local_cea;
  undefined1 local_ce9;
  undefined1 local_ce8;
  undefined1 local_ce7;
  allocator local_ce6;
  cx_string<0UL> local_ce5;
  allocator local_ce4;
  allocator local_ce3;
  allocator local_ce2;
  allocator local_ce1;
  undefined8 local_ce0;
  undefined2 local_cd8;
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  undefined8 local_c70;
  string local_c68 [32];
  string local_c48 [32];
  __atomic_base<unsigned_long> local_c28;
  undefined1 local_c1a;
  undefined1 local_c19;
  undefined1 local_c18;
  undefined1 local_c17;
  allocator local_c16;
  cx_string<0UL> local_c15;
  allocator local_c14;
  allocator local_c13;
  allocator local_c12;
  allocator local_c11;
  undefined8 local_c10;
  undefined2 local_c08;
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  undefined8 local_ba0;
  string local_b98 [32];
  string local_b78 [32];
  __atomic_base<unsigned_long> local_b58;
  undefined1 local_b4a;
  undefined1 local_b49;
  undefined1 local_b48;
  undefined1 local_b47;
  allocator local_b46;
  cx_string<0UL> local_b45;
  allocator local_b44;
  allocator local_b43;
  allocator local_b42;
  allocator local_b41;
  undefined8 local_b40;
  undefined2 local_b38;
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  undefined8 local_ad0;
  string local_ac8 [32];
  string local_aa8 [32];
  __atomic_base<unsigned_long> local_a88;
  undefined1 local_a7a;
  undefined1 local_a79;
  undefined1 local_a78;
  undefined1 local_a77;
  allocator local_a76;
  cx_string<0UL> local_a75;
  allocator local_a74;
  allocator local_a73;
  allocator local_a72;
  allocator local_a71;
  undefined8 local_a70;
  undefined2 local_a68;
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  undefined8 local_a00;
  string local_9f8 [32];
  string local_9d8 [32];
  __atomic_base<unsigned_long> local_9b8;
  undefined1 local_9aa;
  undefined1 local_9a9;
  undefined1 local_9a8;
  undefined1 local_9a7;
  allocator local_9a6;
  cx_string<0UL> local_9a5;
  allocator local_9a4;
  allocator local_9a3;
  allocator local_9a2;
  allocator local_9a1;
  undefined8 local_9a0;
  undefined2 local_998;
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  undefined8 local_930;
  string local_928 [32];
  string local_908 [32];
  __atomic_base<unsigned_long> local_8e8;
  undefined1 local_8da;
  undefined1 local_8d9;
  undefined1 local_8d8;
  undefined1 local_8d7;
  allocator local_8d6;
  cx_string<0UL> local_8d5;
  allocator local_8d4;
  allocator local_8d3;
  allocator local_8d2;
  allocator local_8d1;
  undefined8 local_8d0;
  undefined2 local_8c8;
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  undefined8 local_860;
  string local_858 [32];
  string local_838 [32];
  __atomic_base<unsigned_long> local_818;
  undefined1 local_80a;
  undefined1 local_809;
  undefined1 local_808;
  undefined1 local_807;
  allocator local_806;
  cx_string<0UL> local_805;
  allocator local_804;
  allocator local_803;
  allocator local_802;
  allocator local_801;
  undefined8 local_800;
  undefined2 local_7f8;
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  undefined8 local_790;
  string local_788 [32];
  string local_768 [32];
  __atomic_base<unsigned_long> local_748;
  undefined1 local_73a;
  undefined1 local_739;
  undefined1 local_738;
  undefined1 local_737;
  allocator local_736;
  cx_string<0UL> local_735;
  allocator local_734;
  allocator local_733;
  allocator local_732;
  allocator local_731;
  undefined8 local_730;
  undefined2 local_728;
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  undefined8 local_6c0;
  string local_6b8 [32];
  string local_698 [32];
  __atomic_base<unsigned_long> local_678;
  undefined1 local_66a;
  undefined1 local_669;
  undefined1 local_668;
  undefined1 local_667;
  allocator local_666;
  cx_string<0UL> local_665;
  allocator local_664;
  allocator local_663;
  allocator local_662;
  allocator local_661;
  undefined8 local_660;
  undefined2 local_658;
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  undefined8 local_5f0;
  string local_5e8 [32];
  string local_5c8 [32];
  __atomic_base<unsigned_long> local_5a8;
  undefined1 local_59a;
  undefined1 local_599;
  undefined1 local_598;
  undefined1 local_597;
  allocator local_596;
  cx_string<0UL> local_595;
  allocator local_594;
  allocator local_593;
  allocator local_592;
  allocator local_591;
  undefined8 local_590;
  undefined2 local_588;
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  undefined8 local_520;
  string local_518 [32];
  string local_4f8 [32];
  __atomic_base<unsigned_long> local_4d8;
  undefined1 local_4ca;
  undefined1 local_4c9;
  undefined1 local_4c8;
  undefined1 local_4c7;
  allocator local_4c6;
  cx_string<0UL> local_4c5;
  allocator local_4c4;
  allocator local_4c3;
  allocator local_4c2;
  allocator local_4c1;
  undefined8 local_4c0;
  undefined2 local_4b8;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  undefined8 local_450;
  string local_448 [32];
  string local_428 [32];
  __atomic_base<unsigned_long> local_408;
  undefined1 local_3fd;
  undefined1 local_3fc;
  undefined1 local_3fb;
  undefined1 local_3fa;
  allocator local_3f9;
  cx_string<0UL> local_3f8;
  allocator local_3f7;
  allocator local_3f6;
  allocator local_3f5 [20];
  allocator local_3e1;
  undefined8 local_3e0;
  undefined2 local_3d8;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  undefined8 local_370;
  string local_368 [32];
  string local_348 [32];
  __atomic_base<unsigned_long> local_328;
  Session *local_320;
  undefined4 local_314;
  __atomic_base<unsigned_long> local_310;
  memory_order local_308;
  undefined4 local_304;
  atomic<unsigned_long> *local_300;
  __atomic_base<unsigned_long> local_2f8;
  memory_order local_2f0;
  undefined4 local_2ec;
  atomic<unsigned_long> *local_2e8;
  __atomic_base<unsigned_long> local_2e0;
  memory_order local_2d8;
  undefined4 local_2d4;
  atomic<unsigned_long> *local_2d0;
  __atomic_base<unsigned_long> local_2c8;
  memory_order local_2c0;
  undefined4 local_2bc;
  atomic<unsigned_long> *local_2b8;
  __atomic_base<unsigned_long> local_2b0;
  memory_order local_2a8;
  undefined4 local_2a4;
  atomic<unsigned_long> *local_2a0;
  __atomic_base<unsigned_long> local_298;
  memory_order local_290;
  undefined4 local_28c;
  atomic<unsigned_long> *local_288;
  __atomic_base<unsigned_long> local_280;
  memory_order local_278;
  undefined4 local_274;
  atomic<unsigned_long> *local_270;
  __atomic_base<unsigned_long> local_268;
  memory_order local_260;
  undefined4 local_25c;
  atomic<unsigned_long> *local_258;
  __atomic_base<unsigned_long> local_250;
  memory_order local_248;
  undefined4 local_244;
  atomic<unsigned_long> *local_240;
  __atomic_base<unsigned_long> local_238;
  memory_order local_230;
  undefined4 local_22c;
  atomic<unsigned_long> *local_228;
  __atomic_base<unsigned_long> local_220;
  memory_order local_218;
  undefined4 local_214;
  atomic<unsigned_long> *local_210;
  __atomic_base<unsigned_long> local_208;
  memory_order local_200;
  undefined4 local_1fc;
  atomic<unsigned_long> *local_1f8;
  __atomic_base<unsigned_long> local_1f0;
  memory_order local_1e8;
  undefined4 local_1e4;
  atomic<unsigned_long> *local_1e0;
  __atomic_base<unsigned_long> local_1d8;
  memory_order local_1d0;
  undefined4 local_1cc;
  atomic<unsigned_long> *local_1c8;
  EventSource *local_1c0;
  memory_order local_1b8;
  int local_1b4;
  EventSource *local_1b0;
  atomic<unsigned_long> *local_1a8;
  __int_type local_1a0;
  memory_order local_198;
  int local_194;
  __atomic_base<unsigned_long> local_190;
  atomic<unsigned_long> *local_188;
  __int_type local_180;
  memory_order local_178;
  int local_174;
  __atomic_base<unsigned_long> local_170;
  atomic<unsigned_long> *local_168;
  __int_type local_160;
  memory_order local_158;
  int local_154;
  __atomic_base<unsigned_long> local_150;
  atomic<unsigned_long> *local_148;
  __int_type local_140;
  memory_order local_138;
  int local_134;
  __atomic_base<unsigned_long> local_130;
  atomic<unsigned_long> *local_128;
  __int_type local_120;
  memory_order local_118;
  int local_114;
  __atomic_base<unsigned_long> local_110;
  atomic<unsigned_long> *local_108;
  __int_type local_100;
  memory_order local_f8;
  int local_f4;
  __atomic_base<unsigned_long> local_f0;
  atomic<unsigned_long> *local_e8;
  __int_type local_e0;
  memory_order local_d8;
  int local_d4;
  __atomic_base<unsigned_long> local_d0;
  atomic<unsigned_long> *local_c8;
  __int_type local_c0;
  memory_order local_b8;
  int local_b4;
  __atomic_base<unsigned_long> local_b0;
  atomic<unsigned_long> *local_a8;
  __int_type local_a0;
  memory_order local_98;
  int local_94;
  __atomic_base<unsigned_long> local_90;
  atomic<unsigned_long> *local_88;
  __int_type local_80;
  memory_order local_78;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_314 = 0;
  local_320 = binlog::default_session();
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x102a64);
  if (SVar1 < 0x21) {
    local_1c8 = &main::_binlog_sid;
    local_1cc = 0;
    local_1d0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1d8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_328 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_3e0 = 0;
      local_3d8 = 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"main",&local_3e1);
      local_3fd = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b0,"main",local_3f5);
      local_3fc = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_390,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_3f6);
      local_3fb = 1;
      local_370 = 0x13;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"Default",&local_3f7);
      local_3fa = 1;
      local_3f8 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_3f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_348,*pacVar3,&local_3f9);
      local_3fa = 0;
      local_3fb = 0;
      local_3fc = 0;
      local_3fd = 0;
      local_328._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f7);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f6);
      std::allocator<char>::~allocator((allocator<char> *)local_3f5);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_328._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103064);
  if (SVar1 < 0x401) {
    local_1e0 = &main::_binlog_sid;
    local_1e4 = 0;
    local_1e8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1f0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_408 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_4c0 = 0;
      local_4b8 = 0x400;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b0,"main",&local_4c1);
      local_4ca = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_490,"main",&local_4c2);
      local_4c9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_470,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_4c3);
      local_4c8 = 1;
      local_450 = 0x17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,"Disabled",&local_4c4);
      local_4c7 = 1;
      local_4c5 = binlog::detail::concatenated_tags<char_const(&)[9]>(in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_4c5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,*pacVar3,&local_4c6);
      local_4c7 = 0;
      local_4c8 = 0;
      local_4c9 = 0;
      local_4ca = 0;
      local_408._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c6);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c4);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c3);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c2);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      local_28 = &main::_binlog_sid;
      local_30._M_i = local_408._M_i;
      local_34 = 5;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30._M_i;
      if ((local_34 != 3) && (local_34 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103664);
  if (SVar1 < 0x401) {
    local_1f8 = &main::_binlog_sid;
    local_1fc = 0;
    local_200 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_208 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_4d8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_590 = 0;
      local_588 = 0x400;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,"main",&local_591);
      local_59a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_560,"main",&local_592);
      local_599 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_540,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_593);
      local_598 = 1;
      local_520 = 0x1a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"Enabled",&local_594);
      local_597 = 1;
      local_595 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_595);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f8,*pacVar3,&local_596);
      local_597 = 0;
      local_598 = 0;
      local_599 = 0;
      local_59a = 0;
      local_4d8._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_596);
      std::allocator<char>::~allocator((allocator<char> *)&local_594);
      std::allocator<char>::~allocator((allocator<char> *)&local_593);
      std::allocator<char>::~allocator((allocator<char> *)&local_592);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
      local_48 = &main::_binlog_sid;
      local_50._M_i = local_4d8._M_i;
      local_54 = 5;
      local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_60 = local_50._M_i;
      if ((local_54 != 3) && (local_54 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x103c54);
  if (SVar1 < 0x201) {
    local_210 = &main::_binlog_sid;
    local_214 = 0;
    local_218 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_220 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_5a8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_660 = 0;
      local_658 = 0x200;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_650,"main",&local_661);
      local_66a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_630,"main",&local_662);
      local_669 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_663);
      local_668 = 1;
      local_5f0 = 0x1b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,"Disabled",&local_664);
      local_667 = 1;
      local_665 = binlog::detail::concatenated_tags<char_const(&)[9]>(in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_665);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,*pacVar3,&local_666);
      local_667 = 0;
      local_668 = 0;
      local_669 = 0;
      local_66a = 0;
      local_5a8._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_666);
      std::allocator<char>::~allocator((allocator<char> *)&local_664);
      std::allocator<char>::~allocator((allocator<char> *)&local_663);
      std::allocator<char>::~allocator((allocator<char> *)&local_662);
      std::allocator<char>::~allocator((allocator<char> *)&local_661);
      local_68 = &main::_binlog_sid;
      local_70._M_i = local_5a8._M_i;
      local_74 = 5;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_80 = local_70._M_i;
      if ((local_74 != 3) && (local_74 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_70._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x104254);
  if (SVar1 < 0x201) {
    local_228 = &main::_binlog_sid;
    local_22c = 0;
    local_230 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_238 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_678 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_730 = 0;
      local_728 = 0x200;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_720,"main",&local_731);
      local_73a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_700,"main",&local_732);
      local_739 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_733);
      local_738 = 1;
      local_6c0 = 0x1f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b8,"Enabled",&local_734);
      local_737 = 1;
      local_735 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_735);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_698,*pacVar3,&local_736);
      local_737 = 0;
      local_738 = 0;
      local_739 = 0;
      local_73a = 0;
      local_678._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_736);
      std::allocator<char>::~allocator((allocator<char> *)&local_734);
      std::allocator<char>::~allocator((allocator<char> *)&local_733);
      std::allocator<char>::~allocator((allocator<char> *)&local_732);
      std::allocator<char>::~allocator((allocator<char> *)&local_731);
      local_88 = &main::_binlog_sid;
      local_90._M_i = local_678._M_i;
      local_94 = 5;
      local_98 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_a0 = local_90._M_i;
      if ((local_94 != 3) && (local_94 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_90._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x104844);
  if (SVar1 < 0x101) {
    local_240 = &main::_binlog_sid;
    local_244 = 0;
    local_248 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_250 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_748 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_800 = 0;
      local_7f8 = 0x100;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7f0,"main",&local_801);
      local_80a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d0,"main",&local_802);
      local_809 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_7b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_803);
      local_808 = 1;
      local_790 = 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,"Disabled",&local_804);
      local_807 = 1;
      local_805 = binlog::detail::concatenated_tags<char_const(&)[9]>(in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_805);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_768,*pacVar3,&local_806);
      local_807 = 0;
      local_808 = 0;
      local_809 = 0;
      local_80a = 0;
      local_748._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_806);
      std::allocator<char>::~allocator((allocator<char> *)&local_804);
      std::allocator<char>::~allocator((allocator<char> *)&local_803);
      std::allocator<char>::~allocator((allocator<char> *)&local_802);
      std::allocator<char>::~allocator((allocator<char> *)&local_801);
      local_a8 = &main::_binlog_sid;
      local_b0._M_i = local_748._M_i;
      local_b4 = 5;
      local_b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_c0 = local_b0._M_i;
      if ((local_b4 != 3) && (local_b4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_b0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x104e44);
  if (SVar1 < 0x101) {
    local_258 = &main::_binlog_sid;
    local_25c = 0;
    local_260 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_268 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_818 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_8d0 = 0;
      local_8c8 = 0x100;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c0,"main",&local_8d1);
      local_8da = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8a0,"main",&local_8d2);
      local_8d9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_880,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_8d3);
      local_8d8 = 1;
      local_860 = 0x24;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_858,"Enabled",&local_8d4);
      local_8d7 = 1;
      local_8d5 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_8d5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_838,*pacVar3,&local_8d6);
      local_8d7 = 0;
      local_8d8 = 0;
      local_8d9 = 0;
      local_8da = 0;
      local_818._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d6);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d4);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d3);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d2);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
      local_c8 = &main::_binlog_sid;
      local_d0._M_i = local_818._M_i;
      local_d4 = 5;
      local_d8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_e0 = local_d0._M_i;
      if ((local_d4 != 3) && (local_d4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_d0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x105434);
  if (SVar1 < 0x81) {
    local_270 = &main::_binlog_sid;
    local_274 = 0;
    local_278 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_280 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_8e8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_9a0 = 0;
      local_998 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_990,"main",&local_9a1);
      local_9aa = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_970,"main",&local_9a2);
      local_9a9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_950,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_9a3);
      local_9a8 = 1;
      local_930 = 0x25;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_928,"Disabled",&local_9a4);
      local_9a7 = 1;
      local_9a5 = binlog::detail::concatenated_tags<char_const(&)[9]>(in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_9a5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_908,*pacVar3,&local_9a6);
      local_9a7 = 0;
      local_9a8 = 0;
      local_9a9 = 0;
      local_9aa = 0;
      local_8e8._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a6);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a4);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a3);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a2);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
      local_e8 = &main::_binlog_sid;
      local_f0._M_i = local_8e8._M_i;
      local_f4 = 5;
      local_f8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_100 = local_f0._M_i;
      if ((local_f4 != 3) && (local_f4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_f0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x105a34);
  if (SVar1 < 0x81) {
    local_288 = &main::_binlog_sid;
    local_28c = 0;
    local_290 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_298 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_9b8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_a70 = 0;
      local_a68 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a60,"main",&local_a71);
      local_a7a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a40,"main",&local_a72);
      local_a79 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a20,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a73);
      local_a78 = 1;
      local_a00 = 0x29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9f8,"Enabled",&local_a74);
      local_a77 = 1;
      local_a75 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_a75);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9d8,*pacVar3,&local_a76);
      local_a77 = 0;
      local_a78 = 0;
      local_a79 = 0;
      local_a7a = 0;
      local_9b8._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_a76);
      std::allocator<char>::~allocator((allocator<char> *)&local_a74);
      std::allocator<char>::~allocator((allocator<char> *)&local_a73);
      std::allocator<char>::~allocator((allocator<char> *)&local_a72);
      std::allocator<char>::~allocator((allocator<char> *)&local_a71);
      local_108 = &main::_binlog_sid;
      local_110._M_i = local_9b8._M_i;
      local_114 = 5;
      local_118 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_120 = local_110._M_i;
      if ((local_114 != 3) && (local_114 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_110._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x106024);
  if (SVar1 < 0x41) {
    local_2a0 = &main::_binlog_sid;
    local_2a4 = 0;
    local_2a8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_2b0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_a88 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_b40 = 0;
      local_b38 = 0x40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b30,"main",&local_b41);
      local_b4a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b10,"main",&local_b42);
      local_b49 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_af0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_b43);
      local_b48 = 1;
      local_ad0 = 0x2a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ac8,"Disabled",&local_b44);
      local_b47 = 1;
      local_b45 = binlog::detail::concatenated_tags<char_const(&)[9]>(in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_b45);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa8,*pacVar3,&local_b46);
      local_b47 = 0;
      local_b48 = 0;
      local_b49 = 0;
      local_b4a = 0;
      local_a88._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_b46);
      std::allocator<char>::~allocator((allocator<char> *)&local_b44);
      std::allocator<char>::~allocator((allocator<char> *)&local_b43);
      std::allocator<char>::~allocator((allocator<char> *)&local_b42);
      std::allocator<char>::~allocator((allocator<char> *)&local_b41);
      local_128 = &main::_binlog_sid;
      local_130._M_i = local_a88._M_i;
      local_134 = 5;
      local_138 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_140 = local_130._M_i;
      if ((local_134 != 3) && (local_134 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_130._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x106624);
  if (SVar1 < 0x41) {
    local_2b8 = &main::_binlog_sid;
    local_2bc = 0;
    local_2c0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_2c8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_b58 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_c10 = 0;
      local_c08 = 0x40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c00,"main",&local_c11);
      local_c1a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_be0,"main",&local_c12);
      local_c19 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_bc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_c13);
      local_c18 = 1;
      local_ba0 = 0x2e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b98,"Enabled",&local_c14);
      local_c17 = 1;
      local_c15 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_c15);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b78,*pacVar3,&local_c16);
      local_c17 = 0;
      local_c18 = 0;
      local_c19 = 0;
      local_c1a = 0;
      local_b58._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_c16);
      std::allocator<char>::~allocator((allocator<char> *)&local_c14);
      std::allocator<char>::~allocator((allocator<char> *)&local_c13);
      std::allocator<char>::~allocator((allocator<char> *)&local_c12);
      std::allocator<char>::~allocator((allocator<char> *)&local_c11);
      local_148 = &main::_binlog_sid;
      local_150._M_i = local_b58._M_i;
      local_154 = 5;
      local_158 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_160 = local_150._M_i;
      if ((local_154 != 3) && (local_154 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_150._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x106c14);
  if (SVar1 < 0x21) {
    local_2d0 = &main::_binlog_sid;
    local_2d4 = 0;
    local_2d8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_2e0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_c28 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_ce0 = 0;
      local_cd8 = 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cd0,"main",&local_ce1);
      local_cea = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cb0,"main",&local_ce2);
      local_ce9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_ce3);
      local_ce8 = 1;
      local_c70 = 0x2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c68,"Disabled",&local_ce4);
      local_ce7 = 1;
      local_ce5 = binlog::detail::concatenated_tags<char_const(&)[9]>(in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_ce5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c48,*pacVar3,&local_ce6);
      local_ce7 = 0;
      local_ce8 = 0;
      local_ce9 = 0;
      local_cea = 0;
      local_c28._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce6);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce4);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce3);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce2);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
      local_168 = &main::_binlog_sid;
      local_170._M_i = local_c28._M_i;
      local_174 = 5;
      local_178 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_180 = local_170._M_i;
      if ((local_174 != 3) && (local_174 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_170._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x107214);
  if (SVar1 < 0x21) {
    local_2e8 = &main::_binlog_sid;
    local_2ec = 0;
    local_2f0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_2f8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_cf8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_db0 = 0;
      local_da8 = 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_da0,"main",&local_db1);
      local_dba = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d80,"main",&local_db2);
      local_db9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d60,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_db3);
      local_db8 = 1;
      local_d40 = 0x33;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d38,"Enabled",&local_db4);
      local_db7 = 1;
      local_db5 = binlog::detail::concatenated_tags<char_const(&)[8]>
                            ((char (*) [8])in_stack_ffffffffffffe808);
      pacVar3 = mserialize::cx_string<0UL>::data(&local_db5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d18,*pacVar3,&local_db6);
      local_db7 = 0;
      local_db8 = 0;
      local_db9 = 0;
      local_dba = 0;
      local_cf8._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)&local_db6);
      std::allocator<char>::~allocator((allocator<char> *)&local_db4);
      std::allocator<char>::~allocator((allocator<char> *)&local_db3);
      std::allocator<char>::~allocator((allocator<char> *)&local_db2);
      std::allocator<char>::~allocator((allocator<char> *)&local_db1);
      local_188 = &main::_binlog_sid;
      local_190._M_i = local_cf8._M_i;
      local_194 = 5;
      local_198 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_1a0 = local_190._M_i;
      if ((local_194 != 3) && (local_194 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_190._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[8]>
              ((SessionWriter *)in_stack_ffffffffffffe820,(uint64_t)in_stack_ffffffffffffe818,
               in_stack_ffffffffffffe810._M_i,(char (*) [8])in_stack_ffffffffffffe808);
  }
  binlog::Session::setMinSeverity
            ((Session *)in_stack_ffffffffffffe810._M_i,
             (Severity)((ulong)in_stack_ffffffffffffe808 >> 0x30));
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x107814);
  if (SVar1 < 0x81) {
    local_300 = &main::_binlog_sid;
    local_304 = 0;
    local_308 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_310 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_dc8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_e80._0_3_ = 0;
      local_e80._3_1_ = (string)0x0;
      local_e80._4_4_ = 0;
      local_e78 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e70,"main",&local_e81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e50,"main",&local_e82);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e30,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_e83);
      local_e10 = 0x40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e08,"Call f: {}",&local_e84);
      local_e8d._1_4_ = f();
      local_e86 = binlog::detail::concatenated_tags<char_const(&)[11],int>
                            (in_stack_ffffffffffffe818,(int *)in_stack_ffffffffffffe810._M_i);
      this = (Session *)mserialize::cx_string<1UL>::data(&local_e86);
      eventSource = (EventSource *)local_e8d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_de8,(char *)this,(allocator *)eventSource);
      local_dc8._M_i = binlog::Session::addEventSource(this,eventSource);
      binlog::EventSource::~EventSource((EventSource *)in_stack_ffffffffffffe810._M_i);
      std::allocator<char>::~allocator((allocator<char> *)local_e8d);
      std::allocator<char>::~allocator((allocator<char> *)&local_e84);
      std::allocator<char>::~allocator((allocator<char> *)&local_e83);
      std::allocator<char>::~allocator((allocator<char> *)&local_e82);
      std::allocator<char>::~allocator((allocator<char> *)&local_e81);
      local_1a8 = &main::_binlog_sid;
      local_1b0 = (EventSource *)local_dc8._M_i;
      local_1b4 = 5;
      in_stack_ffffffffffffe820 = &main::_binlog_sid;
      local_1b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_1c0 = local_1b0;
      if (local_1b4 == 3) {
        ((SessionWriter *)in_stack_ffffffffffffe820)->_session = (Session *)local_1b0;
      }
      else if (local_1b4 == 5) {
        LOCK();
        ((SessionWriter *)in_stack_ffffffffffffe820)->_session = (Session *)local_1b0;
        UNLOCK();
      }
      else {
        ((SessionWriter *)in_stack_ffffffffffffe820)->_session = (Session *)local_1b0;
      }
    }
    pSVar2 = binlog::default_thread_local_writer();
    in_stack_ffffffffffffe810._M_i = local_dc8._M_i;
    eventSourceId = binlog::clockNow();
    f();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[11],int>
              ((SessionWriter *)in_stack_ffffffffffffe820,eventSourceId,
               in_stack_ffffffffffffe810._M_i,(char (*) [11])pSVar2,(int *)0x107dbd);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe810._M_i);
  return 0;
}

Assistant:

int main()
{
  binlog::Session& session = binlog::default_session();
  BINLOG_TRACE("Default");
  // Outputs: TRAC Default

  session.setMinSeverity(binlog::Severity::no_logs);
  BINLOG_CRITICAL("Disabled");

  session.setMinSeverity(binlog::Severity::critical);
  BINLOG_CRITICAL("Enabled");
  BINLOG_ERROR("Disabled");
  // Outputs: CRIT Enabled

  session.setMinSeverity(binlog::Severity::error);
  BINLOG_ERROR("Enabled");
  BINLOG_WARN("Disabled");
  // Outputs: ERRO Enabled

  session.setMinSeverity(binlog::Severity::warning);
  BINLOG_WARN("Enabled");
  BINLOG_INFO("Disabled");
  // Outputs: WARN Enabled

  session.setMinSeverity(binlog::Severity::info);
  BINLOG_INFO("Enabled");
  BINLOG_DEBUG("Disabled");
  // Outputs: INFO Enabled

  session.setMinSeverity(binlog::Severity::debug);
  BINLOG_DEBUG("Enabled");
  BINLOG_TRACE("Disabled");
  // Outputs: DEBG Enabled

  session.setMinSeverity(binlog::Severity::trace);
  BINLOG_TRACE("Enabled");
  // Outputs: TRAC Enabled

  // Arguments of disabled severities are not evaluated:

  //[setmin

  session.setMinSeverity(binlog::Severity::warning);
  // trace, debug, info severities are disabled
  //]

  //[noeval
  // after setting min severity to warning above:
  BINLOG_INFO("Call f: {}", f()); // f will not be called
  //]

  binlog::consume(std::cout);
  return 0;
}